

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

bool __thiscall duckdb::RowGroupCollection::IsPersistent(RowGroupCollection *this)

{
  bool bVar1;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  RowGroup *row_group;
  bool bVar2;
  
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_01 = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&this_00->super_SegmentTree<duckdb::RowGroup,_true>);
  while( true ) {
    bVar2 = this_01 == (RowGroup *)0x0;
    if (bVar2) {
      return bVar2;
    }
    bVar1 = RowGroup::IsPersistent(this_01);
    if (!bVar1) break;
    this_01 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                        (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,this_01);
  }
  return bVar2;
}

Assistant:

bool RowGroupCollection::IsPersistent() const {
	for (auto &row_group : row_groups->Segments()) {
		if (!row_group.IsPersistent()) {
			return false;
		}
	}
	return true;
}